

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_4_dec_number(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_intf(&G->data,PVIP_NODE_INT,yytext,(long)yyleng,10);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_4_dec_number(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
  yyprintf((stderr, "do yy_4_dec_number"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
    yy = PVIP_node_new_intf(&(G->data), PVIP_NODE_INT, yytext, yyleng, 10);\n\
}\n"));
  
    yy = PVIP_node_new_intf(&(G->data), PVIP_NODE_INT, yytext, yyleng, 10);
;
}